

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_OperatorFunctionCall_Test::~GslSpan_OperatorFunctionCall_Test
          (GslSpan_OperatorFunctionCall_Test *this)

{
  GslSpan_OperatorFunctionCall_Test *this_local;
  
  ~GslSpan_OperatorFunctionCall_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, OperatorFunctionCall) {
    int arr[4] = {1, 2, 3, 4};

    {
        span<int> s = make_span (arr);
        EXPECT_EQ (s (0), 1);
    }
    {
        int arr2d[2] = {1, 6};
        span<int, 2> s = make_span (arr2d);
        EXPECT_EQ (s (0), 1);
        EXPECT_EQ (s (1), 6);
    }
}